

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

int32_t __thiscall AmpIO::ReadWatchdogPeriod(AmpIO *this,bool applyMask)

{
  BasePort *pBVar1;
  uint local_18;
  byte local_11;
  uint32_t counts;
  bool applyMask_local;
  AmpIO *this_local;
  
  local_18 = 0;
  local_11 = applyMask;
  if ((this->super_FpgaIO).super_BoardIO.port != (BasePort *)0x0) {
    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
    _counts = this;
    (*pBVar1->_vptr_BasePort[0x23])
              (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,3,&local_18);
  }
  if ((local_11 & 1) != 0) {
    local_18 = local_18 & 0xffff;
  }
  return local_18;
}

Assistant:

int32_t AmpIO::ReadWatchdogPeriod(bool applyMask) const
{
    uint32_t counts = 0;
    if (port) {
        port->ReadQuadlet(BoardId, 3, counts);
    }
    if (applyMask)
        counts &= 0x0000ffff;
    return counts;
}